

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::session_impl::verify_incoming_interface(session_impl *this,address *addr)

{
  bool bVar1;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar2;
  bool local_51;
  bitfield_flag local_41;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_40;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_38;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_30;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_20;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  iter;
  address *addr_local;
  session_impl *this_local;
  
  iter._M_current = (shared_ptr<libtorrent::aux::listen_socket_t> *)addr;
  local_28._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::begin(&this->m_listen_sockets);
  local_30 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
             ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::end(&this->m_listen_sockets);
  local_38 = iter._M_current;
  local_20 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>const*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>,libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                       (local_28,(__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  )local_30,(anon_class_8_1_898948ef_for__M_pred)iter._M_current);
  local_40._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::end(&this->m_listen_sockets);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_40);
  if (bVar1) {
    local_51 = false;
  }
  else {
    this_00 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                 ::operator*(&local_20);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    local_41 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )(peVar2->flags).m_val,
                          (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )0x1);
    local_51 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_41);
  }
  return local_51;
}

Assistant:

bool session_impl::verify_incoming_interface(address const& addr) const
	{
		auto const iter = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&addr](std::shared_ptr<listen_socket_t> const& s)
			{ return s->local_endpoint.address() == addr; });
		return iter == m_listen_sockets.end()
			? false
			: bool((*iter)->flags & listen_socket_t::accept_incoming);
	}